

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.cpp
# Opt level: O0

int __thiscall libtorrent::aux::utp_socket_impl::packet_timeout(utp_socket_impl *this)

{
  state_t sVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int local_24;
  int local_20;
  int local_1c;
  utp_socket_impl *puStack_18;
  int timeout;
  utp_socket_impl *this_local;
  
  puStack_18 = this;
  sVar1 = state(this);
  if (sVar1 == none) {
    this_local._4_4_ = 3000;
  }
  else if (this->m_num_timeouts < 7) {
    local_20 = utp_socket_manager::min_timeout(this->m_sm);
    iVar2 = sliding_average<int,_16>::mean(&this->m_rtt);
    iVar3 = sliding_average<int,_16>::avg_deviation(&this->m_rtt);
    local_24 = iVar2 + iVar3 * 2;
    piVar4 = ::std::max<int>(&local_20,&local_24);
    local_1c = *piVar4;
    if (this->m_num_timeouts != '\0') {
      local_1c = (1 << (this->m_num_timeouts - 1 & 0x1f)) * 1000 + local_1c;
    }
    if (60000 < local_1c) {
      local_1c = 60000;
    }
    this_local._4_4_ = local_1c;
  }
  else {
    this_local._4_4_ = 60000;
  }
  return this_local._4_4_;
}

Assistant:

int utp_socket_impl::packet_timeout() const
{
	INVARIANT_CHECK;

	// SYN packets have a bit longer timeout, since we don't
	// have an RTT estimate yet, make a conservative guess
	if (state() == state_t::none) return 3000;

	// avoid overflow by simply capping based on number of timeouts as well
	if (m_num_timeouts >= 7) return 60000;

	int timeout = std::max(m_sm.min_timeout(), m_rtt.mean() + m_rtt.avg_deviation() * 2);
	if (m_num_timeouts > 0) timeout += (1 << (int(m_num_timeouts) - 1)) * 1000;

	// timeouts over 1 minute are capped
	if (timeout > 60000) timeout = 60000;
	return timeout;
}